

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::
PlainTemplatedInternal<int,duckdb::TemplatedParquetValueConversion<long>,true,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  long lVar1;
  long lVar2;
  idx_t row_idx;
  ulong uVar3;
  
  lVar1 = *(long *)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  uVar3 = num_values + result_offset;
  for (; result_offset < uVar3; result_offset = result_offset + 1) {
    if (this->column_schema->max_define == (ulong)defines[result_offset]) {
      lVar2 = ByteBuffer::read<long>(plain_data);
      *(int *)(lVar1 + result_offset * 4) = (int)lVar2;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),result_offset);
    }
  }
  return;
}

Assistant:

void PlainTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines, const uint64_t num_values,
	                            const idx_t result_offset, Vector &result) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		if (!HAS_DEFINES && !CHECKED && CONVERSION::PlainConstantSize() == sizeof(VALUE_TYPE)) {
			// we can memcpy
			idx_t copy_count = num_values * CONVERSION::PlainConstantSize();
			memcpy(result_ptr + result_offset, plain_data.ptr, copy_count);
			plain_data.unsafe_inc(copy_count);
			return;
		}
		auto &result_mask = FlatVector::Validity(result);
		for (idx_t row_idx = result_offset; row_idx < result_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				result_mask.SetInvalid(row_idx);
				continue;
			}
			result_ptr[row_idx] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
		}
	}